

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O1

NodeAVL * avlRotateLeft(NodeAVL *q)

{
  NodeAVL *pNVar1;
  NodeAVL *pNVar2;
  NodeAVL *pNVar3;
  int iVar4;
  int iVar5;
  
  pNVar1 = q->right;
  pNVar2 = pNVar1->left;
  q->right = pNVar2;
  if (pNVar2 != (NodeAVL *)0x0) {
    pNVar2->parent = q;
  }
  pNVar1->left = q;
  pNVar3 = q->parent;
  q->parent = pNVar1;
  pNVar1->parent = pNVar3;
  iVar4 = 0;
  iVar5 = 0;
  if (q->left != (NodeAVL *)0x0) {
    iVar5 = q->left->height;
  }
  if (pNVar2 != (NodeAVL *)0x0) {
    iVar4 = pNVar2->height;
  }
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  iVar4 = iVar4 + 1;
  q->height = iVar4;
  iVar5 = 0;
  if (pNVar1->right != (NodeAVL *)0x0) {
    iVar5 = pNVar1->right->height;
  }
  if (q == (NodeAVL *)0x0) {
    iVar4 = 0;
  }
  if (iVar4 <= iVar5) {
    iVar4 = iVar5;
  }
  pNVar1->height = iVar4 + 1;
  return pNVar1;
}

Assistant:

static
NodeAVL* avlRotateLeft( NodeAVL* q ){
    #ifdef DEBUG_AVL
      printf( "avlRotateLeft id=%d\n", q->id );
    #endif
    NodeAVL* p = q->right;
    q->right = p->left;
    if( p->left ) p->left->parent = q;
    p->left = q;
    NodeAVL* qp = q->parent;
    q->parent = p;
    p->parent = qp;
    avlFixHeight(q);
    avlFixHeight(p);
    return p;
}